

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O0

short jsteemann::atoi_positive<short>(char *p,char *e,bool *valid)

{
  char cVar1;
  bool local_32;
  bool local_30;
  short local_2e;
  char c;
  short result;
  char cutlim;
  short cutoff;
  bool *valid_local;
  char *e_local;
  char *p_local;
  
  if (p == e) {
    *valid = false;
    p_local._6_2_ = 0;
  }
  else {
    local_2e = 0;
    e_local = p;
    do {
      cVar1 = *e_local;
      local_30 = cVar1 < '0' || '9' < cVar1;
      if (local_30) {
        *valid = false;
        return local_2e;
      }
      local_32 = true;
      if (local_2e < 0xccd) {
        local_32 = local_2e == 0xccc && '\a' < (char)(cVar1 + -0x30);
      }
      if (local_32) {
        *valid = false;
        return local_2e;
      }
      local_2e = local_2e * 10 + (short)(char)(cVar1 + -0x30);
      e_local = e_local + 1;
    } while (e_local < e);
    *valid = true;
    p_local._6_2_ = local_2e;
  }
  return p_local._6_2_;
}

Assistant:

inline T atoi_positive(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  constexpr T cutoff = (std::numeric_limits<T>::max)() / 10;
  constexpr char cutlim = (std::numeric_limits<T>::max)() % 10;
  T result = 0;

  do {
    char c = *p;

    // we expect only '0' to '9'. everything else is unexpected
    if (ATOI_UNLIKELY(c < '0' || c > '9')) {
      valid = false;
      return result;
    }

    c -= '0';
    // we expect the bulk of values to not hit the bounds restrictions
    if (ATOI_UNLIKELY(result > cutoff || (result == cutoff && c > cutlim))) {
      valid = false;
      return result;
    } 
    result *= 10;
    result += c;
  } while (++p < e);

  valid = true;
  return result;
}